

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_stats_striped_sse41_128_16.c
# Opt level: O1

parasail_result_t *
parasail_nw_stats_rowcol_striped_profile_sse41_128_16
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  undefined8 *puVar1;
  short *psVar2;
  undefined1 (*pauVar3) [16];
  ushort *puVar4;
  short *psVar5;
  void *pvVar6;
  parasail_matrix_t *ppVar7;
  void *pvVar8;
  void *pvVar9;
  long lVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  undefined1 auVar17 [16];
  short sVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  parasail_result_t *ppVar24;
  __m128i *palVar25;
  __m128i *ptr;
  __m128i *b;
  __m128i *ptr_00;
  __m128i *b_00;
  __m128i *ptr_01;
  __m128i *b_01;
  __m128i *ptr_02;
  __m128i *ptr_03;
  __m128i *b_02;
  __m128i *b_03;
  __m128i *b_04;
  int16_t *ptr_04;
  int16_t iVar26;
  uint uVar27;
  uint uVar28;
  size_t len;
  undefined8 extraout_RDX;
  longlong extraout_RDX_01;
  longlong extraout_RDX_02;
  longlong extraout_RDX_03;
  longlong extraout_RDX_04;
  long lVar29;
  ulong uVar30;
  int iVar31;
  __m128i *ptr_05;
  uint uVar32;
  long lVar33;
  ulong uVar34;
  long lVar35;
  ulong uVar36;
  int32_t segNum;
  long lVar37;
  long lVar38;
  int iVar39;
  undefined2 uVar40;
  long lVar41;
  int iVar42;
  ulong uVar43;
  bool bVar44;
  undefined4 uVar46;
  undefined4 uVar47;
  ulong uVar48;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 extraout_XMM0 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  ulong uVar58;
  ulong uVar59;
  undefined1 auVar63 [16];
  ulong uVar64;
  ulong uVar65;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  ulong uVar68;
  ulong uVar69;
  ushort uVar70;
  ushort uVar72;
  ushort uVar73;
  ushort uVar74;
  ushort uVar75;
  ushort uVar76;
  ushort uVar78;
  ushort uVar80;
  undefined1 auVar71 [16];
  ushort uVar82;
  ushort uVar83;
  ushort uVar84;
  ushort uVar85;
  ushort uVar86;
  ushort uVar87;
  ushort uVar88;
  ushort uVar89;
  ushort uVar90;
  ushort uVar91;
  ushort uVar92;
  ushort uVar93;
  ushort uVar94;
  ushort uVar95;
  ushort uVar96;
  ushort uVar97;
  ushort uVar98;
  ushort uVar99;
  ushort uVar100;
  ushort uVar101;
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 in_XMM7 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  ushort uVar107;
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  short sVar112;
  short sVar115;
  short sVar116;
  short sVar117;
  short sVar118;
  short sVar119;
  short sVar120;
  undefined1 auVar113 [16];
  short sVar121;
  undefined1 auVar114 [16];
  short sVar122;
  short sVar125;
  short sVar126;
  short sVar127;
  short sVar128;
  short sVar129;
  short sVar130;
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  short sVar131;
  __m128i c;
  __m128i c_00;
  __m128i c_01;
  __m128i c_02;
  __m128i c_03;
  __m128i c_04;
  __m128i_16_t e;
  __m128i_16_t h;
  __m128i *local_198;
  __m128i *local_190;
  __m128i *local_188;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  ushort local_a8;
  ushort uStack_a6;
  ushort local_68;
  ushort uStack_66;
  longlong local_58;
  longlong lStack_50;
  longlong local_48;
  longlong lStack_40;
  longlong extraout_RDX_00;
  short sVar45;
  short sVar54;
  short sVar55;
  short sVar56;
  short sVar57;
  short sVar60;
  short sVar61;
  short sVar62;
  ushort uVar77;
  ushort uVar79;
  ushort uVar81;
  
  if (profile == (parasail_profile_t *)0x0) {
    parasail_nw_stats_rowcol_striped_profile_sse41_128_16_cold_8();
  }
  else {
    pvVar6 = (profile->profile16).score;
    if (pvVar6 == (void *)0x0) {
      parasail_nw_stats_rowcol_striped_profile_sse41_128_16_cold_7();
    }
    else {
      ppVar7 = profile->matrix;
      if (ppVar7 == (parasail_matrix_t *)0x0) {
        parasail_nw_stats_rowcol_striped_profile_sse41_128_16_cold_6();
      }
      else {
        uVar27 = profile->s1Len;
        if ((int)uVar27 < 1) {
          parasail_nw_stats_rowcol_striped_profile_sse41_128_16_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_nw_stats_rowcol_striped_profile_sse41_128_16_cold_4();
        }
        else {
          uVar36 = (ulong)(uint)s2Len;
          if (s2Len < 1) {
            parasail_nw_stats_rowcol_striped_profile_sse41_128_16_cold_3();
          }
          else if (open < 0) {
            parasail_nw_stats_rowcol_striped_profile_sse41_128_16_cold_2();
          }
          else if (gap < 0) {
            parasail_nw_stats_rowcol_striped_profile_sse41_128_16_cold_1();
          }
          else {
            iVar31 = uVar27 - 1;
            uVar43 = (ulong)uVar27 + 7 >> 3;
            iVar42 = (int)uVar43;
            iVar19 = iVar31 / iVar42;
            uVar32 = iVar31 % iVar42;
            iVar39 = -open;
            iVar23 = ppVar7->min;
            iVar22 = -iVar23;
            if (iVar23 != iVar39 && SBORROW4(iVar23,iVar39) == iVar23 + open < 0) {
              iVar22 = open;
            }
            pvVar8 = (profile->profile16).matches;
            iVar23 = ppVar7->max;
            pvVar9 = (profile->profile16).similar;
            ppVar24 = parasail_result_new_rowcol3((uint)((ulong)uVar27 + 7) & 0x7ffffff8,s2Len);
            if (ppVar24 != (parasail_result_t *)0x0) {
              ppVar24->flag = ppVar24->flag | 0x8250801;
              palVar25 = parasail_memalign___m128i(0x10,uVar43);
              ptr = parasail_memalign___m128i(0x10,uVar43);
              b = parasail_memalign___m128i(0x10,uVar43);
              ptr_00 = parasail_memalign___m128i(0x10,uVar43);
              b_00 = parasail_memalign___m128i(0x10,uVar43);
              ptr_01 = parasail_memalign___m128i(0x10,uVar43);
              b_01 = parasail_memalign___m128i(0x10,uVar43);
              ptr_02 = parasail_memalign___m128i(0x10,uVar43);
              ptr_03 = parasail_memalign___m128i(0x10,uVar43);
              b_02 = parasail_memalign___m128i(0x10,uVar43);
              b_03 = parasail_memalign___m128i(0x10,uVar43);
              b_04 = parasail_memalign___m128i(0x10,uVar43);
              ptr_04 = parasail_memalign_int16_t(0x10,(ulong)(s2Len + 1));
              c[1]._1_7_ = (undefined7)((ulong)extraout_RDX >> 8);
              c[1]._0_1_ = (b_03 == (__m128i *)0x0 ||
                           (b_02 == (__m128i *)0x0 ||
                           (ptr_03 == (__m128i *)0x0 || ptr_02 == (__m128i *)0x0))) ||
                           ((b_01 == (__m128i *)0x0 ||
                            (ptr_01 == (__m128i *)0x0 || b_00 == (__m128i *)0x0)) ||
                           ((ptr_00 == (__m128i *)0x0 || b == (__m128i *)0x0) ||
                           (ptr == (__m128i *)0x0 || palVar25 == (__m128i *)0x0)));
              len = CONCAT71((int7)((ulong)palVar25 >> 8),
                             (ptr_04 == (int16_t *)0x0 || b_04 == (__m128i *)0x0) || c[1]._0_1_);
              if ((ptr_04 != (int16_t *)0x0 && b_04 != (__m128i *)0x0) &&
                  ((b_03 != (__m128i *)0x0 &&
                   (b_02 != (__m128i *)0x0 && (ptr_03 != (__m128i *)0x0 && ptr_02 != (__m128i *)0x0)
                   )) && ((b_01 != (__m128i *)0x0 &&
                          (ptr_01 != (__m128i *)0x0 && b_00 != (__m128i *)0x0)) &&
                         ((ptr_00 != (__m128i *)0x0 && b != (__m128i *)0x0) &&
                         (ptr != (__m128i *)0x0 && palVar25 != (__m128i *)0x0))))) {
                iVar20 = s2Len + -1;
                iVar21 = 7 - iVar19;
                auVar49 = pshuflw(ZEXT416((uint)open),ZEXT416((uint)open),0);
                uVar46 = auVar49._0_4_;
                auVar49 = pshuflw(ZEXT416((uint)gap),ZEXT416((uint)gap),0);
                uVar47 = auVar49._0_4_;
                auVar49 = pshuflw(ZEXT416(iVar22 - 0x7fff),ZEXT416(iVar22 - 0x7fff),0);
                local_a8 = auVar49._0_2_;
                uStack_a6 = auVar49._2_2_;
                auVar50 = ZEXT416((uint)CONCAT62((int6)((ulong)pvVar8 >> 0x10),
                                                 0x7ffe - (short)iVar23));
                auVar50 = pshuflw(auVar50,auVar50,0);
                c[0] = uVar43;
                parasail_memset___m128i(b,c,len);
                c_00[1] = extraout_RDX_00;
                c_00[0] = uVar43;
                parasail_memset___m128i(b_00,c_00,len);
                c_01[1] = extraout_RDX_01;
                c_01[0] = uVar43;
                parasail_memset___m128i(b_01,c_01,len);
                c_02[1] = extraout_RDX_02;
                c_02[0] = uVar43;
                parasail_memset___m128i(b_02,c_02,len);
                c_03[1] = extraout_RDX_03;
                c_03[0] = uVar43;
                parasail_memset___m128i(b_03,c_03,len);
                pmovsxbw(extraout_XMM0,0x101010101010101);
                c_04[1] = extraout_RDX_04;
                c_04[0] = uVar43;
                parasail_memset___m128i(b_04,c_04,len);
                lVar29 = (long)iVar39;
                uVar34 = 0;
                do {
                  lVar37 = 0;
                  lVar35 = lVar29;
                  do {
                    uVar40 = 0x8000;
                    if (-0x8000 < lVar35) {
                      uVar40 = (undefined2)lVar35;
                    }
                    *(undefined2 *)((long)&local_48 + lVar37 * 2) = uVar40;
                    lVar41 = lVar35 - (ulong)(uint)open;
                    if (lVar41 < -0x7fff) {
                      lVar41 = -0x8000;
                    }
                    *(short *)((long)&local_58 + lVar37 * 2) = (short)lVar41;
                    lVar37 = lVar37 + 1;
                    lVar35 = lVar35 - uVar43 * (uint)gap;
                  } while (lVar37 != 8);
                  palVar25[uVar34][0] = local_48;
                  palVar25[uVar34][1] = lStack_40;
                  ptr_03[uVar34][0] = local_58;
                  ptr_03[uVar34][1] = lStack_50;
                  uVar34 = uVar34 + 1;
                  lVar29 = lVar29 - (ulong)(uint)gap;
                } while (uVar34 != uVar43);
                *ptr_04 = 0;
                uVar34 = 1;
                do {
                  iVar26 = -0x8000;
                  if (-0x8000 < iVar39) {
                    iVar26 = (int16_t)iVar39;
                  }
                  ptr_04[uVar34] = iVar26;
                  uVar34 = uVar34 + 1;
                  iVar39 = iVar39 - gap;
                } while (s2Len + 1 != uVar34);
                uVar27 = iVar42 - 1;
                iVar23 = 1;
                if (1 < iVar21) {
                  iVar23 = iVar21;
                }
                if (s2Len < 2) {
                  uVar36 = 1;
                }
                lVar29 = (ulong)(iVar42 + (uint)(iVar42 == 0)) << 4;
                uVar34 = 0;
                local_68 = auVar50._0_2_;
                uStack_66 = auVar50._2_2_;
                uVar82 = local_68;
                uVar83 = uStack_66;
                uVar84 = local_68;
                uVar85 = uStack_66;
                uVar86 = local_68;
                uVar87 = uStack_66;
                uVar88 = local_68;
                uVar89 = uStack_66;
                uVar90 = local_a8;
                uVar91 = uStack_a6;
                uVar92 = local_a8;
                uVar94 = uStack_a6;
                uVar95 = local_a8;
                uVar97 = uStack_a6;
                uVar98 = local_a8;
                uVar100 = uStack_a6;
                do {
                  local_188 = ptr_00;
                  local_190 = ptr_01;
                  local_198 = ptr_02;
                  ptr_00 = b;
                  ptr_05 = ptr;
                  ptr_02 = b_01;
                  ptr_01 = b_00;
                  ptr = palVar25;
                  uVar69 = ptr[uVar27][0];
                  uVar30 = ptr_00[uVar27][0];
                  uVar65 = ptr_01[uVar27][0];
                  uVar68 = ptr_02[uVar27][0];
                  auVar109._0_8_ = uVar30 << 0x10;
                  auVar109._8_8_ = ptr_00[uVar27][1] << 0x10 | uVar30 >> 0x30;
                  auVar108._0_8_ = uVar65 << 0x10;
                  auVar108._8_8_ = ptr_01[uVar27][1] << 0x10 | uVar65 >> 0x30;
                  auVar113._0_8_ = uVar68 << 0x10;
                  auVar113._8_8_ = ptr_02[uVar27][1] << 0x10 | uVar68 >> 0x30;
                  auVar50._8_8_ = ptr[uVar27][1] << 0x10 | uVar69 >> 0x30;
                  auVar50._0_8_ = uVar69 << 0x10 | (ulong)(ushort)ptr_04[uVar34];
                  lVar35 = (long)ppVar7->mapper[(byte)s2[uVar34]] * uVar43 * 0x10;
                  auVar102 = (undefined1  [16])0x0;
                  lVar37 = 0;
                  in_XMM7 = pmovsxbw(in_XMM7,0x101010101010101);
                  auVar104 = (undefined1  [16])0x0;
                  auVar124._4_2_ = local_a8;
                  auVar124._0_4_ = auVar49._0_4_;
                  auVar124._6_2_ = uStack_a6;
                  auVar124._8_2_ = local_a8;
                  auVar124._10_2_ = uStack_a6;
                  auVar124._12_2_ = local_a8;
                  auVar124._14_2_ = uStack_a6;
                  do {
                    auVar50 = paddsw(auVar50,*(undefined1 (*) [16])((long)pvVar6 + lVar37 + lVar35))
                    ;
                    pauVar3 = (undefined1 (*) [16])((long)*ptr_03 + lVar37);
                    sVar18 = *(short *)*pauVar3;
                    sVar45 = *(short *)(*pauVar3 + 2);
                    sVar54 = *(short *)(*pauVar3 + 4);
                    sVar55 = *(short *)(*pauVar3 + 6);
                    sVar56 = *(short *)(*pauVar3 + 8);
                    sVar57 = *(short *)(*pauVar3 + 10);
                    sVar60 = *(short *)(*pauVar3 + 0xc);
                    sVar61 = *(short *)(*pauVar3 + 0xe);
                    auVar51 = *pauVar3;
                    uVar93 = auVar50._0_2_;
                    uVar70 = (ushort)((short)uVar93 < sVar18) * sVar18 |
                             ((short)uVar93 >= sVar18) * uVar93;
                    uVar96 = auVar50._2_2_;
                    uVar72 = (ushort)((short)uVar96 < sVar45) * sVar45 |
                             ((short)uVar96 >= sVar45) * uVar96;
                    uVar99 = auVar50._4_2_;
                    uVar73 = (ushort)((short)uVar99 < sVar54) * sVar54 |
                             ((short)uVar99 >= sVar54) * uVar99;
                    uVar101 = auVar50._6_2_;
                    uVar74 = (ushort)((short)uVar101 < sVar55) * sVar55 |
                             ((short)uVar101 >= sVar55) * uVar101;
                    uVar107 = auVar50._8_2_;
                    uVar75 = (ushort)((short)uVar107 < sVar56) * sVar56 |
                             ((short)uVar107 >= sVar56) * uVar107;
                    uVar77 = auVar50._10_2_;
                    uVar76 = (ushort)((short)uVar77 < sVar57) * sVar57 |
                             ((short)uVar77 >= sVar57) * uVar77;
                    uVar79 = auVar50._12_2_;
                    uVar81 = auVar50._14_2_;
                    uVar78 = (ushort)((short)uVar79 < sVar60) * sVar60 |
                             ((short)uVar79 >= sVar60) * uVar79;
                    uVar80 = (ushort)((short)uVar81 < sVar61) * sVar61 |
                             ((short)uVar81 >= sVar61) * uVar81;
                    sVar18 = auVar124._0_2_;
                    auVar66._0_2_ =
                         (ushort)((short)uVar70 < sVar18) * sVar18 |
                         ((short)uVar70 >= sVar18) * uVar70;
                    sVar45 = auVar124._2_2_;
                    auVar66._2_2_ =
                         (ushort)((short)uVar72 < sVar45) * sVar45 |
                         ((short)uVar72 >= sVar45) * uVar72;
                    sVar54 = auVar124._4_2_;
                    auVar66._4_2_ =
                         (ushort)((short)uVar73 < sVar54) * sVar54 |
                         ((short)uVar73 >= sVar54) * uVar73;
                    sVar55 = auVar124._6_2_;
                    auVar66._6_2_ =
                         (ushort)((short)uVar74 < sVar55) * sVar55 |
                         ((short)uVar74 >= sVar55) * uVar74;
                    sVar56 = auVar124._8_2_;
                    auVar66._8_2_ =
                         (ushort)((short)uVar75 < sVar56) * sVar56 |
                         ((short)uVar75 >= sVar56) * uVar75;
                    sVar57 = auVar124._10_2_;
                    auVar66._10_2_ =
                         (ushort)((short)uVar76 < sVar57) * sVar57 |
                         ((short)uVar76 >= sVar57) * uVar76;
                    sVar60 = auVar124._12_2_;
                    auVar66._12_2_ =
                         (ushort)((short)uVar78 < sVar60) * sVar60 |
                         ((short)uVar78 >= sVar60) * uVar78;
                    sVar61 = auVar124._14_2_;
                    auVar66._14_2_ =
                         (ushort)((short)uVar80 < sVar61) * sVar61 |
                         ((short)uVar80 >= sVar61) * uVar80;
                    auVar50 = *(undefined1 (*) [16])((long)*b_02 + lVar37);
                    auVar114 = *(undefined1 (*) [16])((long)*b_03 + lVar37);
                    pauVar3 = (undefined1 (*) [16])((long)*b_04 + lVar37);
                    auVar17 = *pauVar3;
                    auVar111 = *pauVar3;
                    *(undefined1 (*) [16])((long)*ptr_05 + lVar37) = auVar66;
                    auVar123._0_2_ = -(ushort)(sVar18 < (short)uVar70);
                    auVar123._2_2_ = -(ushort)(sVar45 < (short)uVar72);
                    auVar123._4_2_ = -(ushort)(sVar54 < (short)uVar73);
                    auVar123._6_2_ = -(ushort)(sVar55 < (short)uVar74);
                    auVar123._8_2_ = -(ushort)(sVar56 < (short)uVar75);
                    auVar123._10_2_ = -(ushort)(sVar57 < (short)uVar76);
                    auVar123._12_2_ = -(ushort)(sVar60 < (short)uVar78);
                    auVar123._14_2_ = -(ushort)(sVar61 < (short)uVar80);
                    auVar105 = pblendvb(auVar104,auVar50,auVar123);
                    auVar109 = paddsw(auVar109,*(undefined1 (*) [16])
                                                ((long)pvVar8 + lVar37 + lVar35));
                    auVar63._0_2_ = -(ushort)(uVar93 == auVar66._0_2_);
                    auVar63._2_2_ = -(ushort)(uVar96 == auVar66._2_2_);
                    auVar63._4_2_ = -(ushort)(uVar99 == auVar66._4_2_);
                    auVar63._6_2_ = -(ushort)(uVar101 == auVar66._6_2_);
                    auVar63._8_2_ = -(ushort)(uVar107 == auVar66._8_2_);
                    auVar63._10_2_ = -(ushort)(uVar77 == auVar66._10_2_);
                    auVar63._12_2_ = -(ushort)(uVar79 == auVar66._12_2_);
                    auVar63._14_2_ = -(ushort)(uVar81 == auVar66._14_2_);
                    auVar106 = pblendvb(auVar105,auVar109,auVar63);
                    *(undefined1 (*) [16])((long)*local_188 + lVar37) = auVar106;
                    auVar105 = pblendvb(auVar102,auVar114,auVar123);
                    auVar109 = paddsw(auVar108,*(undefined1 (*) [16])
                                                ((long)pvVar9 + lVar37 + lVar35));
                    auVar110 = pblendvb(auVar105,auVar109,auVar63);
                    *(undefined1 (*) [16])((long)*local_190 + lVar37) = auVar110;
                    auVar108 = pblendvb(in_XMM7,auVar111,auVar123);
                    auVar109 = pmovsxbw(auVar123,0x101010101010101);
                    auVar123 = paddsw(auVar113,auVar109);
                    auVar108 = pblendvb(auVar108,auVar123,auVar63);
                    *(undefined1 (*) [16])((long)*local_198 + lVar37) = auVar108;
                    uVar82 = ((short)auVar66._0_2_ < (short)uVar82) * auVar66._0_2_ |
                             ((short)auVar66._0_2_ >= (short)uVar82) * uVar82;
                    uVar83 = ((short)auVar66._2_2_ < (short)uVar83) * auVar66._2_2_ |
                             ((short)auVar66._2_2_ >= (short)uVar83) * uVar83;
                    uVar84 = ((short)auVar66._4_2_ < (short)uVar84) * auVar66._4_2_ |
                             ((short)auVar66._4_2_ >= (short)uVar84) * uVar84;
                    uVar85 = ((short)auVar66._6_2_ < (short)uVar85) * auVar66._6_2_ |
                             ((short)auVar66._6_2_ >= (short)uVar85) * uVar85;
                    uVar86 = ((short)auVar66._8_2_ < (short)uVar86) * auVar66._8_2_ |
                             ((short)auVar66._8_2_ >= (short)uVar86) * uVar86;
                    uVar87 = ((short)auVar66._10_2_ < (short)uVar87) * auVar66._10_2_ |
                             ((short)auVar66._10_2_ >= (short)uVar87) * uVar87;
                    uVar88 = ((short)auVar66._12_2_ < (short)uVar88) * auVar66._12_2_ |
                             ((short)auVar66._12_2_ >= (short)uVar88) * uVar88;
                    uVar89 = ((short)auVar66._14_2_ < (short)uVar89) * auVar66._14_2_ |
                             ((short)auVar66._14_2_ >= (short)uVar89) * uVar89;
                    uVar90 = ((short)uVar90 < (short)auVar66._0_2_) * auVar66._0_2_ |
                             ((short)uVar90 >= (short)auVar66._0_2_) * uVar90;
                    uVar70 = ((short)uVar91 < (short)auVar66._2_2_) * auVar66._2_2_ |
                             ((short)uVar91 >= (short)auVar66._2_2_) * uVar91;
                    uVar93 = ((short)uVar92 < (short)auVar66._4_2_) * auVar66._4_2_ |
                             ((short)uVar92 >= (short)auVar66._4_2_) * uVar92;
                    uVar72 = ((short)uVar94 < (short)auVar66._6_2_) * auVar66._6_2_ |
                             ((short)uVar94 >= (short)auVar66._6_2_) * uVar94;
                    uVar96 = ((short)uVar95 < (short)auVar66._8_2_) * auVar66._8_2_ |
                             ((short)uVar95 >= (short)auVar66._8_2_) * uVar95;
                    uVar73 = ((short)uVar97 < (short)auVar66._10_2_) * auVar66._10_2_ |
                             ((short)uVar97 >= (short)auVar66._10_2_) * uVar97;
                    uVar99 = ((short)uVar98 < (short)auVar66._12_2_) * auVar66._12_2_ |
                             ((short)uVar98 >= (short)auVar66._12_2_) * uVar98;
                    uVar74 = ((short)uVar100 < (short)auVar66._14_2_) * auVar66._14_2_ |
                             ((short)uVar100 >= (short)auVar66._14_2_) * uVar100;
                    sVar18 = auVar108._0_2_;
                    sVar45 = auVar110._0_2_;
                    uVar91 = (ushort)(sVar45 < sVar18) * sVar18 |
                             (ushort)(sVar45 >= sVar18) * sVar45;
                    sVar18 = auVar108._2_2_;
                    sVar45 = auVar110._2_2_;
                    uVar92 = (ushort)(sVar45 < sVar18) * sVar18 |
                             (ushort)(sVar45 >= sVar18) * sVar45;
                    sVar18 = auVar108._4_2_;
                    sVar45 = auVar110._4_2_;
                    uVar94 = (ushort)(sVar45 < sVar18) * sVar18 |
                             (ushort)(sVar45 >= sVar18) * sVar45;
                    sVar18 = auVar108._6_2_;
                    sVar45 = auVar110._6_2_;
                    uVar95 = (ushort)(sVar45 < sVar18) * sVar18 |
                             (ushort)(sVar45 >= sVar18) * sVar45;
                    sVar18 = auVar108._8_2_;
                    sVar45 = auVar110._8_2_;
                    uVar97 = (ushort)(sVar45 < sVar18) * sVar18 |
                             (ushort)(sVar45 >= sVar18) * sVar45;
                    sVar18 = auVar108._10_2_;
                    sVar45 = auVar110._10_2_;
                    uVar98 = (ushort)(sVar45 < sVar18) * sVar18 |
                             (ushort)(sVar45 >= sVar18) * sVar45;
                    sVar18 = auVar108._12_2_;
                    sVar45 = auVar110._12_2_;
                    sVar54 = auVar110._14_2_;
                    uVar100 = (ushort)(sVar45 < sVar18) * sVar18 |
                              (ushort)(sVar45 >= sVar18) * sVar45;
                    sVar18 = auVar108._14_2_;
                    uVar101 = (ushort)(sVar54 < sVar18) * sVar18 |
                              (ushort)(sVar54 >= sVar18) * sVar54;
                    auVar105._4_4_ = uVar46;
                    auVar105._0_4_ = uVar46;
                    auVar105._8_4_ = uVar46;
                    auVar105._12_4_ = uVar46;
                    auVar109 = psubsw(auVar66,auVar105);
                    auVar111._4_4_ = uVar47;
                    auVar111._0_4_ = uVar47;
                    auVar111._8_4_ = uVar47;
                    auVar111._12_4_ = uVar47;
                    auVar113 = psubsw(auVar51,auVar111);
                    sVar45 = auVar109._0_2_;
                    sVar112 = auVar113._0_2_;
                    auVar51._0_2_ = -(ushort)(sVar112 < sVar45);
                    sVar54 = auVar109._2_2_;
                    sVar115 = auVar113._2_2_;
                    auVar51._2_2_ = -(ushort)(sVar115 < sVar54);
                    sVar55 = auVar109._4_2_;
                    sVar116 = auVar113._4_2_;
                    auVar51._4_2_ = -(ushort)(sVar116 < sVar55);
                    sVar56 = auVar109._6_2_;
                    sVar117 = auVar113._6_2_;
                    auVar51._6_2_ = -(ushort)(sVar117 < sVar56);
                    sVar57 = auVar109._8_2_;
                    sVar118 = auVar113._8_2_;
                    auVar51._8_2_ = -(ushort)(sVar118 < sVar57);
                    sVar60 = auVar109._10_2_;
                    sVar119 = auVar113._10_2_;
                    auVar51._10_2_ = -(ushort)(sVar119 < sVar60);
                    sVar61 = auVar109._12_2_;
                    sVar120 = auVar113._12_2_;
                    sVar62 = auVar109._14_2_;
                    auVar51._12_2_ = -(ushort)(sVar120 < sVar61);
                    sVar121 = auVar113._14_2_;
                    auVar51._14_2_ = -(ushort)(sVar121 < sVar62);
                    auVar50 = pblendvb(auVar50,auVar106,auVar51);
                    auVar113 = pblendvb(auVar114,auVar110,auVar51);
                    auVar109 = pmovsxbw(auVar123,0x101010101010101);
                    auVar114 = paddsw(auVar17,auVar109);
                    auVar109 = paddsw(auVar108,auVar109);
                    auVar108 = pblendvb(auVar114,auVar109,auVar51);
                    auVar124 = psubsw(auVar124,auVar111);
                    sVar122 = auVar124._0_2_;
                    auVar114._0_2_ = -(ushort)(sVar122 < sVar45);
                    sVar125 = auVar124._2_2_;
                    auVar114._2_2_ = -(ushort)(sVar125 < sVar54);
                    sVar126 = auVar124._4_2_;
                    auVar114._4_2_ = -(ushort)(sVar126 < sVar55);
                    sVar127 = auVar124._6_2_;
                    auVar114._6_2_ = -(ushort)(sVar127 < sVar56);
                    sVar128 = auVar124._8_2_;
                    auVar114._8_2_ = -(ushort)(sVar128 < sVar57);
                    sVar129 = auVar124._10_2_;
                    auVar114._10_2_ = -(ushort)(sVar129 < sVar60);
                    sVar130 = auVar124._12_2_;
                    auVar114._12_2_ = -(ushort)(sVar130 < sVar61);
                    sVar131 = auVar124._14_2_;
                    auVar114._14_2_ = -(ushort)(sVar131 < sVar62);
                    auVar104 = pblendvb(auVar104,auVar106,auVar114);
                    sVar18 = auVar106._0_2_;
                    uVar90 = (ushort)((short)uVar90 < sVar18) * sVar18 |
                             ((short)uVar90 >= sVar18) * uVar90;
                    sVar18 = auVar106._2_2_;
                    uVar70 = (ushort)((short)uVar70 < sVar18) * sVar18 |
                             ((short)uVar70 >= sVar18) * uVar70;
                    sVar18 = auVar106._4_2_;
                    uVar93 = (ushort)((short)uVar93 < sVar18) * sVar18 |
                             ((short)uVar93 >= sVar18) * uVar93;
                    sVar18 = auVar106._6_2_;
                    uVar72 = (ushort)((short)uVar72 < sVar18) * sVar18 |
                             ((short)uVar72 >= sVar18) * uVar72;
                    sVar18 = auVar106._8_2_;
                    uVar96 = (ushort)((short)uVar96 < sVar18) * sVar18 |
                             ((short)uVar96 >= sVar18) * uVar96;
                    sVar18 = auVar106._10_2_;
                    uVar73 = (ushort)((short)uVar73 < sVar18) * sVar18 |
                             ((short)uVar73 >= sVar18) * uVar73;
                    sVar18 = auVar106._12_2_;
                    uVar99 = (ushort)((short)uVar99 < sVar18) * sVar18 |
                             ((short)uVar99 >= sVar18) * uVar99;
                    sVar18 = auVar106._14_2_;
                    uVar74 = (ushort)((short)uVar74 < sVar18) * sVar18 |
                             ((short)uVar74 >= sVar18) * uVar74;
                    uVar90 = ((short)uVar91 < (short)uVar90) * uVar90 |
                             ((short)uVar91 >= (short)uVar90) * uVar91;
                    uVar91 = ((short)uVar92 < (short)uVar70) * uVar70 |
                             ((short)uVar92 >= (short)uVar70) * uVar92;
                    uVar92 = ((short)uVar94 < (short)uVar93) * uVar93 |
                             ((short)uVar94 >= (short)uVar93) * uVar94;
                    uVar94 = ((short)uVar95 < (short)uVar72) * uVar72 |
                             ((short)uVar95 >= (short)uVar72) * uVar95;
                    uVar95 = ((short)uVar97 < (short)uVar96) * uVar96 |
                             ((short)uVar97 >= (short)uVar96) * uVar97;
                    uVar97 = ((short)uVar98 < (short)uVar73) * uVar73 |
                             ((short)uVar98 >= (short)uVar73) * uVar98;
                    uVar98 = ((short)uVar100 < (short)uVar99) * uVar99 |
                             ((short)uVar100 >= (short)uVar99) * uVar100;
                    uVar100 = ((short)uVar101 < (short)uVar74) * uVar74 |
                              ((short)uVar101 >= (short)uVar74) * uVar101;
                    puVar4 = (ushort *)((long)*ptr_03 + lVar37);
                    *puVar4 = (ushort)(sVar45 < sVar112) * sVar112 |
                              (ushort)(sVar45 >= sVar112) * sVar45;
                    puVar4[1] = (ushort)(sVar54 < sVar115) * sVar115 |
                                (ushort)(sVar54 >= sVar115) * sVar54;
                    puVar4[2] = (ushort)(sVar55 < sVar116) * sVar116 |
                                (ushort)(sVar55 >= sVar116) * sVar55;
                    puVar4[3] = (ushort)(sVar56 < sVar117) * sVar117 |
                                (ushort)(sVar56 >= sVar117) * sVar56;
                    puVar4[4] = (ushort)(sVar57 < sVar118) * sVar118 |
                                (ushort)(sVar57 >= sVar118) * sVar57;
                    puVar4[5] = (ushort)(sVar60 < sVar119) * sVar119 |
                                (ushort)(sVar60 >= sVar119) * sVar60;
                    puVar4[6] = (ushort)(sVar61 < sVar120) * sVar120 |
                                (ushort)(sVar61 >= sVar120) * sVar61;
                    puVar4[7] = (ushort)(sVar62 < sVar121) * sVar121 |
                                (ushort)(sVar62 >= sVar121) * sVar62;
                    local_158 = auVar50._0_8_;
                    uStack_150 = auVar50._8_8_;
                    puVar1 = (undefined8 *)((long)*b_02 + lVar37);
                    *puVar1 = local_158;
                    puVar1[1] = uStack_150;
                    local_168 = auVar113._0_8_;
                    uStack_160 = auVar113._8_8_;
                    puVar1 = (undefined8 *)((long)*b_03 + lVar37);
                    *puVar1 = local_168;
                    puVar1[1] = uStack_160;
                    *(undefined1 (*) [16])((long)*b_04 + lVar37) = auVar108;
                    auVar124._0_2_ =
                         (ushort)(sVar45 < sVar122) * sVar122 | (ushort)(sVar45 >= sVar122) * sVar45
                    ;
                    auVar124._2_2_ =
                         (ushort)(sVar54 < sVar125) * sVar125 | (ushort)(sVar54 >= sVar125) * sVar54
                    ;
                    auVar124._4_2_ =
                         (ushort)(sVar55 < sVar126) * sVar126 | (ushort)(sVar55 >= sVar126) * sVar55
                    ;
                    auVar124._6_2_ =
                         (ushort)(sVar56 < sVar127) * sVar127 | (ushort)(sVar56 >= sVar127) * sVar56
                    ;
                    auVar124._8_2_ =
                         (ushort)(sVar57 < sVar128) * sVar128 | (ushort)(sVar57 >= sVar128) * sVar57
                    ;
                    auVar124._10_2_ =
                         (ushort)(sVar60 < sVar129) * sVar129 | (ushort)(sVar60 >= sVar129) * sVar60
                    ;
                    auVar124._12_2_ =
                         (ushort)(sVar61 < sVar130) * sVar130 | (ushort)(sVar61 >= sVar130) * sVar61
                    ;
                    auVar124._14_2_ =
                         (ushort)(sVar62 < sVar131) * sVar131 | (ushort)(sVar62 >= sVar131) * sVar62
                    ;
                    auVar102 = pblendvb(auVar102,auVar110,auVar114);
                    auVar50 = paddsw(in_XMM7,_DAT_008d0b80);
                    in_XMM7 = pblendvb(auVar50,auVar109,auVar114);
                    auVar50 = *(undefined1 (*) [16])((long)*ptr + lVar37);
                    auVar109 = *(undefined1 (*) [16])((long)*ptr_00 + lVar37);
                    auVar108 = *(undefined1 (*) [16])((long)*ptr_01 + lVar37);
                    auVar113 = *(undefined1 (*) [16])((long)*ptr_02 + lVar37);
                    lVar37 = lVar37 + 0x10;
                  } while (lVar29 != lVar37);
                  auVar106._4_4_ = uVar46;
                  auVar106._0_4_ = uVar46;
                  auVar106._8_4_ = uVar46;
                  auVar106._12_4_ = uVar46;
                  auVar17._4_4_ = uVar47;
                  auVar17._0_4_ = uVar47;
                  auVar17._8_4_ = uVar47;
                  auVar17._12_4_ = uVar47;
                  auVar50 = pmovsxbw(auVar113,0x101010101010101);
                  uVar28 = 0;
                  do {
                    uVar69 = ptr[uVar27][0];
                    uVar30 = (ulong)(uint)(ptr_04[uVar34 + 1] - open);
                    if (ptr_04[uVar34 + 1] - open < -0x7fff) {
                      uVar30 = 0xffff8000;
                    }
                    lVar37 = auVar104._8_8_;
                    uVar65 = auVar104._0_8_;
                    auVar104._0_8_ = uVar65 << 0x10;
                    auVar104._8_8_ = lVar37 << 0x10 | uVar65 >> 0x30;
                    auVar110._8_8_ = ptr[uVar27][1] << 0x10 | uVar69 >> 0x30;
                    auVar110._0_8_ = uVar69 << 0x10 | (ulong)(ushort)ptr_04[uVar34];
                    lVar37 = auVar102._8_8_;
                    uVar69 = auVar102._0_8_;
                    auVar102._0_8_ = uVar69 << 0x10;
                    auVar102._8_8_ = lVar37 << 0x10 | uVar69 >> 0x30;
                    uVar69 = auVar124._0_8_;
                    auVar124._8_8_ = auVar124._8_8_ << 0x10 | uVar69 >> 0x30;
                    auVar124._0_8_ = uVar69 << 0x10 | uVar30 & 0xffff;
                    uVar69 = in_XMM7._0_8_;
                    in_XMM7._8_8_ = in_XMM7._8_8_ << 0x10 | uVar69 >> 0x30;
                    in_XMM7._0_8_ = uVar69 << 0x10 | 1;
                    lVar37 = 0;
                    do {
                      auVar110 = paddsw(auVar110,*(undefined1 (*) [16])
                                                  ((long)pvVar6 + lVar37 + lVar35));
                      psVar2 = (short *)((long)*ptr_05 + lVar37);
                      sVar62 = *psVar2;
                      sVar112 = psVar2[1];
                      sVar115 = psVar2[2];
                      sVar116 = psVar2[3];
                      sVar117 = psVar2[4];
                      sVar118 = psVar2[5];
                      sVar119 = psVar2[6];
                      sVar120 = psVar2[7];
                      sVar18 = auVar124._0_2_;
                      auVar67._0_2_ =
                           (ushort)(sVar62 < sVar18) * sVar18 | (ushort)(sVar62 >= sVar18) * sVar62;
                      sVar45 = auVar124._2_2_;
                      auVar67._2_2_ =
                           (ushort)(sVar112 < sVar45) * sVar45 |
                           (ushort)(sVar112 >= sVar45) * sVar112;
                      sVar54 = auVar124._4_2_;
                      auVar67._4_2_ =
                           (ushort)(sVar115 < sVar54) * sVar54 |
                           (ushort)(sVar115 >= sVar54) * sVar115;
                      sVar55 = auVar124._6_2_;
                      auVar67._6_2_ =
                           (ushort)(sVar116 < sVar55) * sVar55 |
                           (ushort)(sVar116 >= sVar55) * sVar116;
                      sVar56 = auVar124._8_2_;
                      auVar67._8_2_ =
                           (ushort)(sVar117 < sVar56) * sVar56 |
                           (ushort)(sVar117 >= sVar56) * sVar117;
                      sVar57 = auVar124._10_2_;
                      auVar67._10_2_ =
                           (ushort)(sVar118 < sVar57) * sVar57 |
                           (ushort)(sVar118 >= sVar57) * sVar118;
                      sVar60 = auVar124._12_2_;
                      auVar67._12_2_ =
                           (ushort)(sVar119 < sVar60) * sVar60 |
                           (ushort)(sVar119 >= sVar60) * sVar119;
                      sVar61 = auVar124._14_2_;
                      auVar67._14_2_ =
                           (ushort)(sVar120 < sVar61) * sVar61 |
                           (ushort)(sVar120 >= sVar61) * sVar120;
                      *(undefined1 (*) [16])((long)*ptr_05 + lVar37) = auVar67;
                      auVar71._0_2_ = -(ushort)(auVar67._0_2_ == auVar110._0_2_);
                      auVar71._2_2_ = -(ushort)(auVar67._2_2_ == auVar110._2_2_);
                      auVar71._4_2_ = -(ushort)(auVar67._4_2_ == auVar110._4_2_);
                      auVar71._6_2_ = -(ushort)(auVar67._6_2_ == auVar110._6_2_);
                      auVar71._8_2_ = -(ushort)(auVar67._8_2_ == auVar110._8_2_);
                      auVar71._10_2_ = -(ushort)(auVar67._10_2_ == auVar110._10_2_);
                      auVar71._12_2_ = -(ushort)(auVar67._12_2_ == auVar110._12_2_);
                      auVar71._14_2_ = -(ushort)(auVar67._14_2_ == auVar110._14_2_);
                      auVar52._0_2_ = -(ushort)(sVar18 < sVar62);
                      auVar52._2_2_ = -(ushort)(sVar45 < sVar112);
                      auVar52._4_2_ = -(ushort)(sVar54 < sVar115);
                      auVar52._6_2_ = -(ushort)(sVar55 < sVar116);
                      auVar52._8_2_ = -(ushort)(sVar56 < sVar117);
                      auVar52._10_2_ = -(ushort)(sVar57 < sVar118);
                      auVar52._12_2_ = -(ushort)(sVar60 < sVar119);
                      auVar52._14_2_ = -(ushort)(sVar61 < sVar120);
                      auVar52 = auVar52 | auVar71;
                      auVar108 = pblendvb(auVar104,*(undefined1 (*) [16])((long)*local_188 + lVar37)
                                          ,auVar52);
                      *(undefined1 (*) [16])((long)*local_188 + lVar37) = auVar108;
                      auVar113 = pblendvb(auVar102,*(undefined1 (*) [16])((long)*local_190 + lVar37)
                                          ,auVar52);
                      *(undefined1 (*) [16])((long)*local_190 + lVar37) = auVar113;
                      auVar114 = pblendvb(in_XMM7,*(undefined1 (*) [16])((long)*local_198 + lVar37),
                                          auVar52);
                      *(undefined1 (*) [16])((long)*local_198 + lVar37) = auVar114;
                      auVar109 = psubsw(auVar67,auVar106);
                      auVar111 = psubsw(auVar124,auVar17);
                      auVar53._0_2_ = -(ushort)(auVar111._0_2_ < auVar109._0_2_);
                      auVar53._2_2_ = -(ushort)(auVar111._2_2_ < auVar109._2_2_);
                      auVar53._4_2_ = -(ushort)(auVar111._4_2_ < auVar109._4_2_);
                      auVar53._6_2_ = -(ushort)(auVar111._6_2_ < auVar109._6_2_);
                      auVar53._8_2_ = -(ushort)(auVar111._8_2_ < auVar109._8_2_);
                      auVar53._10_2_ = -(ushort)(auVar111._10_2_ < auVar109._10_2_);
                      auVar53._12_2_ = -(ushort)(auVar111._12_2_ < auVar109._12_2_);
                      auVar53._14_2_ = -(ushort)(auVar111._14_2_ < auVar109._14_2_);
                      uVar70 = ((ushort)(SUB161(auVar53 >> 7,0) & 1) |
                                (ushort)(SUB161(auVar53 >> 0xf,0) & 1) << 1 |
                                (ushort)(SUB161(auVar53 >> 0x17,0) & 1) << 2 |
                                (ushort)(SUB161(auVar53 >> 0x1f,0) & 1) << 3 |
                                (ushort)(SUB161(auVar53 >> 0x27,0) & 1) << 4 |
                                (ushort)(SUB161(auVar53 >> 0x2f,0) & 1) << 5 |
                                (ushort)(SUB161(auVar53 >> 0x37,0) & 1) << 6 |
                                (ushort)(SUB161(auVar53 >> 0x3f,0) & 1) << 7 |
                                (ushort)(SUB161(auVar53 >> 0x47,0) & 1) << 8 |
                                (ushort)(SUB161(auVar53 >> 0x4f,0) & 1) << 9 |
                                (ushort)(SUB161(auVar53 >> 0x57,0) & 1) << 10 |
                                (ushort)(SUB161(auVar53 >> 0x5f,0) & 1) << 0xb |
                                (ushort)(SUB161(auVar53 >> 0x67,0) & 1) << 0xc |
                                (ushort)(SUB161(auVar53 >> 0x6f,0) & 1) << 0xd |
                                (ushort)((byte)(auVar53._14_2_ >> 7) & 1) << 0xe |
                               auVar53._14_2_ & 0x8000) ^ 0xffff;
                      if (uVar70 == 0) {
                        iVar22 = 0x27;
                      }
                      else {
                        auVar104 = pblendvb(auVar104,auVar108,auVar53);
                        auVar102 = pblendvb(auVar102,auVar113,auVar53);
                        auVar124 = paddsw(in_XMM7,auVar50);
                        auVar109 = paddsw(auVar114,auVar50);
                        in_XMM7 = pblendvb(auVar124,auVar109,auVar53);
                        auVar110 = *(undefined1 (*) [16])((long)*ptr + lVar37);
                        iVar22 = 0;
                        auVar124 = auVar111;
                      }
                      uVar82 = ((short)auVar67._0_2_ < (short)uVar82) * auVar67._0_2_ |
                               ((short)auVar67._0_2_ >= (short)uVar82) * uVar82;
                      uVar83 = ((short)auVar67._2_2_ < (short)uVar83) * auVar67._2_2_ |
                               ((short)auVar67._2_2_ >= (short)uVar83) * uVar83;
                      uVar84 = ((short)auVar67._4_2_ < (short)uVar84) * auVar67._4_2_ |
                               ((short)auVar67._4_2_ >= (short)uVar84) * uVar84;
                      uVar85 = ((short)auVar67._6_2_ < (short)uVar85) * auVar67._6_2_ |
                               ((short)auVar67._6_2_ >= (short)uVar85) * uVar85;
                      uVar86 = ((short)auVar67._8_2_ < (short)uVar86) * auVar67._8_2_ |
                               ((short)auVar67._8_2_ >= (short)uVar86) * uVar86;
                      uVar87 = ((short)auVar67._10_2_ < (short)uVar87) * auVar67._10_2_ |
                               ((short)auVar67._10_2_ >= (short)uVar87) * uVar87;
                      uVar88 = ((short)auVar67._12_2_ < (short)uVar88) * auVar67._12_2_ |
                               ((short)auVar67._12_2_ >= (short)uVar88) * uVar88;
                      uVar89 = ((short)auVar67._14_2_ < (short)uVar89) * auVar67._14_2_ |
                               ((short)auVar67._14_2_ >= (short)uVar89) * uVar89;
                      uVar90 = ((short)uVar90 < (short)auVar67._0_2_) * auVar67._0_2_ |
                               ((short)uVar90 >= (short)auVar67._0_2_) * uVar90;
                      uVar91 = ((short)uVar91 < (short)auVar67._2_2_) * auVar67._2_2_ |
                               ((short)uVar91 >= (short)auVar67._2_2_) * uVar91;
                      uVar92 = ((short)uVar92 < (short)auVar67._4_2_) * auVar67._4_2_ |
                               ((short)uVar92 >= (short)auVar67._4_2_) * uVar92;
                      uVar94 = ((short)uVar94 < (short)auVar67._6_2_) * auVar67._6_2_ |
                               ((short)uVar94 >= (short)auVar67._6_2_) * uVar94;
                      uVar95 = ((short)uVar95 < (short)auVar67._8_2_) * auVar67._8_2_ |
                               ((short)uVar95 >= (short)auVar67._8_2_) * uVar95;
                      uVar97 = ((short)uVar97 < (short)auVar67._10_2_) * auVar67._10_2_ |
                               ((short)uVar97 >= (short)auVar67._10_2_) * uVar97;
                      uVar98 = ((short)uVar98 < (short)auVar67._12_2_) * auVar67._12_2_ |
                               ((short)uVar98 >= (short)auVar67._12_2_) * uVar98;
                      uVar100 = ((short)uVar100 < (short)auVar67._14_2_) * auVar67._14_2_ |
                                ((short)uVar100 >= (short)auVar67._14_2_) * uVar100;
                      sVar18 = auVar108._0_2_;
                      uVar90 = (ushort)((short)uVar90 < sVar18) * sVar18 |
                               ((short)uVar90 >= sVar18) * uVar90;
                      sVar18 = auVar108._2_2_;
                      uVar91 = (ushort)((short)uVar91 < sVar18) * sVar18 |
                               ((short)uVar91 >= sVar18) * uVar91;
                      sVar18 = auVar108._4_2_;
                      uVar92 = (ushort)((short)uVar92 < sVar18) * sVar18 |
                               ((short)uVar92 >= sVar18) * uVar92;
                      sVar18 = auVar108._6_2_;
                      uVar94 = (ushort)((short)uVar94 < sVar18) * sVar18 |
                               ((short)uVar94 >= sVar18) * uVar94;
                      sVar18 = auVar108._8_2_;
                      uVar95 = (ushort)((short)uVar95 < sVar18) * sVar18 |
                               ((short)uVar95 >= sVar18) * uVar95;
                      sVar18 = auVar108._10_2_;
                      uVar97 = (ushort)((short)uVar97 < sVar18) * sVar18 |
                               ((short)uVar97 >= sVar18) * uVar97;
                      sVar18 = auVar108._12_2_;
                      uVar98 = (ushort)((short)uVar98 < sVar18) * sVar18 |
                               ((short)uVar98 >= sVar18) * uVar98;
                      sVar18 = auVar108._14_2_;
                      uVar100 = (ushort)((short)uVar100 < sVar18) * sVar18 |
                                ((short)uVar100 >= sVar18) * uVar100;
                      sVar18 = auVar114._0_2_;
                      sVar45 = auVar113._0_2_;
                      uVar93 = (ushort)(sVar45 < sVar18) * sVar18 |
                               (ushort)(sVar45 >= sVar18) * sVar45;
                      sVar18 = auVar114._2_2_;
                      sVar45 = auVar113._2_2_;
                      uVar72 = (ushort)(sVar45 < sVar18) * sVar18 |
                               (ushort)(sVar45 >= sVar18) * sVar45;
                      sVar18 = auVar114._4_2_;
                      sVar45 = auVar113._4_2_;
                      uVar96 = (ushort)(sVar45 < sVar18) * sVar18 |
                               (ushort)(sVar45 >= sVar18) * sVar45;
                      sVar18 = auVar114._6_2_;
                      sVar45 = auVar113._6_2_;
                      uVar73 = (ushort)(sVar45 < sVar18) * sVar18 |
                               (ushort)(sVar45 >= sVar18) * sVar45;
                      sVar18 = auVar114._8_2_;
                      sVar45 = auVar113._8_2_;
                      uVar99 = (ushort)(sVar45 < sVar18) * sVar18 |
                               (ushort)(sVar45 >= sVar18) * sVar45;
                      sVar18 = auVar114._10_2_;
                      sVar45 = auVar113._10_2_;
                      uVar74 = (ushort)(sVar45 < sVar18) * sVar18 |
                               (ushort)(sVar45 >= sVar18) * sVar45;
                      sVar18 = auVar114._12_2_;
                      sVar45 = auVar113._12_2_;
                      sVar54 = auVar113._14_2_;
                      uVar101 = (ushort)(sVar45 < sVar18) * sVar18 |
                                (ushort)(sVar45 >= sVar18) * sVar45;
                      sVar18 = auVar114._14_2_;
                      uVar107 = (ushort)(sVar54 < sVar18) * sVar18 |
                                (ushort)(sVar54 >= sVar18) * sVar54;
                      uVar90 = ((short)uVar93 < (short)uVar90) * uVar90 |
                               ((short)uVar93 >= (short)uVar90) * uVar93;
                      uVar91 = ((short)uVar72 < (short)uVar91) * uVar91 |
                               ((short)uVar72 >= (short)uVar91) * uVar72;
                      uVar92 = ((short)uVar96 < (short)uVar92) * uVar92 |
                               ((short)uVar96 >= (short)uVar92) * uVar96;
                      uVar94 = ((short)uVar73 < (short)uVar94) * uVar94 |
                               ((short)uVar73 >= (short)uVar94) * uVar73;
                      uVar95 = ((short)uVar99 < (short)uVar95) * uVar95 |
                               ((short)uVar99 >= (short)uVar95) * uVar99;
                      uVar97 = ((short)uVar74 < (short)uVar97) * uVar97 |
                               ((short)uVar74 >= (short)uVar97) * uVar74;
                      uVar98 = ((short)uVar101 < (short)uVar98) * uVar98 |
                               ((short)uVar101 >= (short)uVar98) * uVar101;
                      uVar100 = ((short)uVar107 < (short)uVar100) * uVar100 |
                                ((short)uVar107 >= (short)uVar100) * uVar107;
                      if (uVar70 == 0) goto LAB_00718c93;
                      lVar37 = lVar37 + 0x10;
                    } while (lVar29 != lVar37);
                    iVar22 = 0;
LAB_00718c93:
                  } while ((iVar22 == 0) && (bVar44 = uVar28 < 7, uVar28 = uVar28 + 1, bVar44));
                  uVar69 = ptr_05[uVar32][0];
                  uVar30 = ptr_05[uVar32][1];
                  uVar65 = local_188[uVar32][0];
                  uVar68 = local_188[uVar32][1];
                  uVar59 = local_190[uVar32][0];
                  uVar64 = local_190[uVar32][1];
                  uVar48 = local_198[uVar32][0];
                  uVar58 = local_198[uVar32][1];
                  iVar22 = iVar23;
                  if (iVar19 < 7) {
                    do {
                      uVar30 = uVar30 << 0x10 | uVar69 >> 0x30;
                      uVar68 = uVar68 << 0x10 | uVar65 >> 0x30;
                      uVar64 = uVar64 << 0x10 | uVar59 >> 0x30;
                      uVar58 = uVar58 << 0x10 | uVar48 >> 0x30;
                      iVar22 = iVar22 + -1;
                      uVar69 = uVar69 << 0x10;
                      uVar65 = uVar65 << 0x10;
                      uVar59 = uVar59 << 0x10;
                      uVar48 = uVar48 << 0x10;
                    } while (iVar22 != 0);
                  }
                  *(int *)(*((ppVar24->field_4).trace)->trace_del_table + uVar34 * 4) =
                       (int)(short)(uVar30 >> 0x30);
                  *(int *)(*(long *)((long)((ppVar24->field_4).trace)->trace_del_table + 8) +
                          uVar34 * 4) = (int)(short)(uVar68 >> 0x30);
                  *(int *)(*(long *)((long)((ppVar24->field_4).trace)->trace_del_table + 0x10) +
                          uVar34 * 4) = (int)(short)(uVar64 >> 0x30);
                  *(int *)(*(long *)((long)((ppVar24->field_4).trace)->trace_del_table + 0x18) +
                          uVar34 * 4) = (int)(short)(uVar58 >> 0x30);
                  uVar34 = uVar34 + 1;
                  palVar25 = ptr_05;
                  b_00 = local_190;
                  b_01 = local_198;
                  b = local_188;
                  if (uVar34 == uVar36) {
                    lVar29 = uVar43 * 8;
                    lVar35 = (ulong)(uint)(iVar42 * 4) * 3;
                    lVar33 = uVar43 * 0x10;
                    lVar37 = (ulong)(uint)(iVar42 * 4) * 5;
                    lVar41 = uVar43 * 0x18;
                    lVar10 = uVar43 * 0x1c;
                    uVar43 = 0;
                    uVar36 = (ulong)(uint)(iVar42 * 4);
                    do {
                      psVar2 = (short *)((long)*ptr_05 + uVar43 * 4);
                      sVar18 = psVar2[1];
                      sVar45 = psVar2[2];
                      sVar54 = psVar2[3];
                      sVar55 = psVar2[4];
                      sVar56 = psVar2[5];
                      sVar57 = psVar2[6];
                      sVar60 = psVar2[7];
                      psVar5 = (short *)((long)*local_188 + uVar43 * 4);
                      sVar61 = *psVar5;
                      sVar62 = psVar5[1];
                      sVar112 = psVar5[2];
                      sVar115 = psVar5[3];
                      sVar116 = psVar5[4];
                      sVar117 = psVar5[5];
                      sVar118 = psVar5[6];
                      sVar119 = psVar5[7];
                      psVar5 = (short *)((long)*local_190 + uVar43 * 4);
                      sVar120 = *psVar5;
                      sVar121 = psVar5[1];
                      sVar122 = psVar5[2];
                      sVar125 = psVar5[3];
                      sVar126 = psVar5[4];
                      sVar127 = psVar5[5];
                      sVar128 = psVar5[6];
                      sVar129 = psVar5[7];
                      psVar5 = (short *)((long)*local_198 + uVar43 * 4);
                      sVar130 = *psVar5;
                      sVar131 = psVar5[1];
                      sVar11 = psVar5[2];
                      sVar12 = psVar5[3];
                      sVar13 = psVar5[4];
                      sVar14 = psVar5[5];
                      sVar15 = psVar5[6];
                      sVar16 = psVar5[7];
                      lVar38 = *(long *)((long)((ppVar24->field_4).trace)->trace_del_table + 0x20);
                      *(int *)(lVar38 + uVar43) = (int)*psVar2;
                      lVar38 = lVar38 + uVar43;
                      *(int *)(uVar36 + lVar38) = (int)sVar18;
                      *(int *)(lVar29 + lVar38) = (int)sVar45;
                      *(int *)(lVar35 + lVar38) = (int)sVar54;
                      *(int *)(lVar33 + lVar38) = (int)sVar55;
                      *(int *)(lVar37 + lVar38) = (int)sVar56;
                      *(int *)(lVar41 + lVar38) = (int)sVar57;
                      *(int *)(lVar10 + lVar38) = (int)sVar60;
                      lVar38 = *(long *)((long)((ppVar24->field_4).trace)->trace_del_table + 0x28);
                      *(int *)(lVar38 + uVar43) = (int)sVar61;
                      lVar38 = lVar38 + uVar43;
                      *(int *)(uVar36 + lVar38) = (int)sVar62;
                      *(int *)(lVar29 + lVar38) = (int)sVar112;
                      *(int *)(lVar35 + lVar38) = (int)sVar115;
                      *(int *)(lVar33 + lVar38) = (int)sVar116;
                      *(int *)(lVar37 + lVar38) = (int)sVar117;
                      *(int *)(lVar41 + lVar38) = (int)sVar118;
                      *(int *)(lVar10 + lVar38) = (int)sVar119;
                      lVar38 = *(long *)((long)((ppVar24->field_4).trace)->trace_del_table + 0x30);
                      *(int *)(lVar38 + uVar43) = (int)sVar120;
                      lVar38 = lVar38 + uVar43;
                      *(int *)(uVar36 + lVar38) = (int)sVar121;
                      *(int *)(lVar29 + lVar38) = (int)sVar122;
                      *(int *)(lVar35 + lVar38) = (int)sVar125;
                      *(int *)(lVar33 + lVar38) = (int)sVar126;
                      *(int *)(lVar37 + lVar38) = (int)sVar127;
                      *(int *)(lVar41 + lVar38) = (int)sVar128;
                      *(int *)(lVar10 + lVar38) = (int)sVar129;
                      lVar38 = *(long *)((long)((ppVar24->field_4).trace)->trace_del_table + 0x38);
                      *(int *)(lVar38 + uVar43) = (int)sVar130;
                      lVar38 = lVar38 + uVar43;
                      *(int *)(uVar36 + lVar38) = (int)sVar131;
                      *(int *)(lVar29 + lVar38) = (int)sVar11;
                      *(int *)(lVar35 + lVar38) = (int)sVar12;
                      *(int *)(lVar33 + lVar38) = (int)sVar13;
                      *(int *)(lVar37 + lVar38) = (int)sVar14;
                      *(int *)(lVar41 + lVar38) = (int)sVar15;
                      *(int *)(lVar10 + lVar38) = (int)sVar16;
                      uVar43 = uVar43 + 4;
                    } while ((iVar42 + (uint)(iVar42 == 0)) * 4 != uVar43);
                    uVar36 = ptr_05[uVar32][0];
                    uVar43 = ptr_05[uVar32][1];
                    uVar34 = local_188[uVar32][0];
                    uVar69 = local_188[uVar32][1];
                    uVar30 = local_190[uVar32][0];
                    uVar65 = local_190[uVar32][1];
                    uVar68 = local_198[uVar32][0];
                    uVar59 = local_198[uVar32][1];
                    if (iVar19 < 7) {
                      iVar23 = 1;
                      if (1 < iVar21) {
                        iVar23 = iVar21;
                      }
                      do {
                        uVar43 = uVar43 << 0x10 | uVar36 >> 0x30;
                        uVar69 = uVar69 << 0x10 | uVar34 >> 0x30;
                        uVar65 = uVar65 << 0x10 | uVar30 >> 0x30;
                        uVar59 = uVar59 << 0x10 | uVar68 >> 0x30;
                        iVar23 = iVar23 + -1;
                        uVar36 = uVar36 << 0x10;
                        uVar34 = uVar34 << 0x10;
                        uVar30 = uVar30 << 0x10;
                        uVar68 = uVar68 << 0x10;
                      } while (iVar23 != 0);
                    }
                    auVar103._0_2_ = -(ushort)((short)uVar82 < (short)local_a8);
                    auVar103._2_2_ = -(ushort)((short)uVar83 < (short)uStack_a6);
                    auVar103._4_2_ = -(ushort)((short)uVar84 < (short)local_a8);
                    auVar103._6_2_ = -(ushort)((short)uVar85 < (short)uStack_a6);
                    auVar103._8_2_ = -(ushort)((short)uVar86 < (short)local_a8);
                    auVar103._10_2_ = -(ushort)((short)uVar87 < (short)uStack_a6);
                    auVar103._12_2_ = -(ushort)((short)uVar88 < (short)local_a8);
                    auVar103._14_2_ = -(ushort)((short)uVar89 < (short)uStack_a6);
                    auVar49._0_2_ = -(ushort)((short)local_68 < (short)uVar90);
                    auVar49._2_2_ = -(ushort)((short)uStack_66 < (short)uVar91);
                    auVar49._4_2_ = -(ushort)((short)local_68 < (short)uVar92);
                    auVar49._6_2_ = -(ushort)((short)uStack_66 < (short)uVar94);
                    auVar49._8_2_ = -(ushort)((short)local_68 < (short)uVar95);
                    auVar49._10_2_ = -(ushort)((short)uStack_66 < (short)uVar97);
                    auVar49._12_2_ = -(ushort)((short)local_68 < (short)uVar98);
                    auVar49._14_2_ = -(ushort)((short)uStack_66 < (short)uVar100);
                    auVar49 = auVar49 | auVar103;
                    if ((((((((((((((((auVar49 >> 7 & (undefined1  [16])0x1) ==
                                      (undefined1  [16])0x0 &&
                                     (auVar49 >> 0xf & (undefined1  [16])0x1) ==
                                     (undefined1  [16])0x0) &&
                                    (auVar49 >> 0x17 & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0) &&
                                   (auVar49 >> 0x1f & (undefined1  [16])0x1) ==
                                   (undefined1  [16])0x0) &&
                                  (auVar49 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0
                                  ) && (auVar49 >> 0x2f & (undefined1  [16])0x1) ==
                                       (undefined1  [16])0x0) &&
                                (auVar49 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                               && (auVar49 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0
                               ) && (auVar49 >> 0x47 & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0) &&
                             (auVar49 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                            (auVar49 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                           (auVar49 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar49 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                         (auVar49 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar49 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        -1 < auVar49[0xf]) {
                      sVar18 = (short)(uVar43 >> 0x30);
                      sVar45 = (short)(uVar69 >> 0x30);
                      sVar54 = (short)(uVar65 >> 0x30);
                      sVar55 = (short)(uVar59 >> 0x30);
                    }
                    else {
                      *(byte *)&ppVar24->flag = (byte)ppVar24->flag | 0x40;
                      sVar18 = 0;
                      sVar45 = 0;
                      sVar54 = 0;
                      sVar55 = 0;
                      iVar20 = 0;
                      iVar31 = 0;
                    }
                    ppVar24->score = (int)sVar18;
                    ppVar24->end_query = iVar31;
                    ppVar24->end_ref = iVar20;
                    *(int *)(ppVar24->field_4).extra = (int)sVar45;
                    ((ppVar24->field_4).stats)->similar = (int)sVar54;
                    ((ppVar24->field_4).stats)->length = (int)sVar55;
                    parasail_free(ptr_04);
                    parasail_free(b_04);
                    parasail_free(b_03);
                    parasail_free(b_02);
                    parasail_free(ptr_03);
                    parasail_free(ptr_02);
                    parasail_free(local_198);
                    parasail_free(ptr_01);
                    parasail_free(local_190);
                    parasail_free(ptr_00);
                    parasail_free(local_188);
                    parasail_free(ptr);
                    parasail_free(ptr_05);
                    return ppVar24;
                  }
                } while( true );
              }
            }
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m128i* restrict vProfile = NULL;
    __m128i* restrict vProfileM = NULL;
    __m128i* restrict vProfileS = NULL;
    __m128i* restrict pvHStore = NULL;
    __m128i* restrict pvHLoad = NULL;
    __m128i* restrict pvHMStore = NULL;
    __m128i* restrict pvHMLoad = NULL;
    __m128i* restrict pvHSStore = NULL;
    __m128i* restrict pvHSLoad = NULL;
    __m128i* restrict pvHLStore = NULL;
    __m128i* restrict pvHLLoad = NULL;
    __m128i* restrict pvE = NULL;
    __m128i* restrict pvEM = NULL;
    __m128i* restrict pvES = NULL;
    __m128i* restrict pvEL = NULL;
    int16_t* restrict boundary = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int16_t NEG_LIMIT = 0;
    int16_t POS_LIMIT = 0;
    __m128i vZero;
    __m128i vOne;
    int16_t score = 0;
    int16_t matches = 0;
    int16_t similar = 0;
    int16_t length = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile16.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 8; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    vProfile  = (__m128i*)profile->profile16.score;
    vProfileM = (__m128i*)profile->profile16.matches;
    vProfileS = (__m128i*)profile->profile16.similar;
    vGapO = _mm_set1_epi16(open);
    vGapE = _mm_set1_epi16(gap);
    NEG_LIMIT = (-open < matrix->min ? INT16_MIN + open : INT16_MIN - matrix->min) + 1;
    POS_LIMIT = INT16_MAX - matrix->max - 1;
    vZero = _mm_setzero_si128();
    vOne = _mm_set1_epi16(1);
    score = NEG_LIMIT;
    matches = 0;
    similar = 0;
    length = 0;
    vNegLimit = _mm_set1_epi16(NEG_LIMIT);
    vPosLimit = _mm_set1_epi16(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table3(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol3(segLen*segWidth, s2Len);
#else
    result = parasail_result_new_stats();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_STATS
        | PARASAIL_FLAG_BITS_16 | PARASAIL_FLAG_LANES_8;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore  = parasail_memalign___m128i(16, segLen);
    pvHLoad   = parasail_memalign___m128i(16, segLen);
    pvHMStore = parasail_memalign___m128i(16, segLen);
    pvHMLoad  = parasail_memalign___m128i(16, segLen);
    pvHSStore = parasail_memalign___m128i(16, segLen);
    pvHSLoad  = parasail_memalign___m128i(16, segLen);
    pvHLStore = parasail_memalign___m128i(16, segLen);
    pvHLLoad  = parasail_memalign___m128i(16, segLen);
    pvE       = parasail_memalign___m128i(16, segLen);
    pvEM      = parasail_memalign___m128i(16, segLen);
    pvES      = parasail_memalign___m128i(16, segLen);
    pvEL      = parasail_memalign___m128i(16, segLen);
    boundary  = parasail_memalign_int16_t(16, s2Len+1);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvHMStore) return NULL;
    if (!pvHMLoad) return NULL;
    if (!pvHSStore) return NULL;
    if (!pvHSLoad) return NULL;
    if (!pvHLStore) return NULL;
    if (!pvHLLoad) return NULL;
    if (!pvE) return NULL;
    if (!pvEM) return NULL;
    if (!pvES) return NULL;
    if (!pvEL) return NULL;
    if (!boundary) return NULL;

    parasail_memset___m128i(pvHMStore, vZero, segLen);
    parasail_memset___m128i(pvHSStore, vZero, segLen);
    parasail_memset___m128i(pvHLStore, vZero, segLen);
    parasail_memset___m128i(pvEM, vZero, segLen);
    parasail_memset___m128i(pvES, vZero, segLen);
    parasail_memset___m128i(pvEL, vOne, segLen);

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m128i_16_t h;
            __m128i_16_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = -open-gap*(segNum*segLen+i);
                h.v[segNum] = tmp < INT16_MIN ? INT16_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT16_MIN ? INT16_MIN : tmp;
            }
            _mm_store_si128(&pvHStore[index], h.m);
            _mm_store_si128(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = -open-gap*(i-1);
            boundary[i] = tmp < INT16_MIN ? INT16_MIN : tmp;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vEF_opn;
        __m128i vE;
        __m128i vE_ext;
        __m128i vEM;
        __m128i vES;
        __m128i vEL;
        __m128i vF;
        __m128i vF_ext;
        __m128i vFM;
        __m128i vFS;
        __m128i vFL;
        __m128i vH;
        __m128i vH_dag;
        __m128i vHM;
        __m128i vHS;
        __m128i vHL;
        const __m128i* vP = NULL;
        const __m128i* vPM = NULL;
        const __m128i* vPS = NULL;

        /* Initialize F value to neg inf.  Any errors to vH values will
         * be corrected in the Lazy_F loop.  */
        vF = vNegLimit;
        vFM = vZero;
        vFS = vZero;
        vFL = vOne;

        /* load final segment of pvHStore and shift left by 2 bytes */
        vH = _mm_load_si128(&pvHStore[segLen - 1]);
        vHM = _mm_load_si128(&pvHMStore[segLen - 1]);
        vHS = _mm_load_si128(&pvHSStore[segLen - 1]);
        vHL = _mm_load_si128(&pvHLStore[segLen - 1]);
        vH = _mm_slli_si128(vH, 2);
        vHM = _mm_slli_si128(vHM, 2);
        vHS = _mm_slli_si128(vHS, 2);
        vHL = _mm_slli_si128(vHL, 2);

        /* insert upper boundary condition */
        vH = _mm_insert_epi16(vH, boundary[j], 0);

        /* Correct part of the vProfile */
        vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;
        vPM = vProfileM + matrix->mapper[(unsigned char)s2[j]] * segLen;
        vPS = vProfileS + matrix->mapper[(unsigned char)s2[j]] * segLen;

        /* Swap the 2 H buffers. */
        SWAP(pvHLoad,  pvHStore)
        SWAP(pvHMLoad, pvHMStore)
        SWAP(pvHSLoad, pvHSStore)
        SWAP(pvHLLoad, pvHLStore)

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            __m128i case1;
            __m128i case2;

            vE = _mm_load_si128(pvE+ i);
            vEM = _mm_load_si128(pvEM+ i);
            vES = _mm_load_si128(pvES+ i);
            vEL = _mm_load_si128(pvEL+ i);

            /* Get max from vH, vE and vF. */
            vH_dag = _mm_adds_epi16(vH, _mm_load_si128(vP + i));
            vH = _mm_max_epi16(vH_dag, vE);
            vH = _mm_max_epi16(vH, vF);
            /* Save vH values. */
            _mm_store_si128(pvHStore + i, vH);

            case1 = _mm_cmpeq_epi16(vH, vH_dag);
            case2 = _mm_cmpeq_epi16(vH, vF);

            /* calculate vM */
            vHM = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEM, vFM, case2),
                    _mm_adds_epi16(vHM, _mm_load_si128(vPM + i)),
                    case1);
            _mm_store_si128(pvHMStore + i, vHM);

            /* calculate vS */
            vHS = _mm_blendv_epi8(
                    _mm_blendv_epi8(vES, vFS, case2),
                    _mm_adds_epi16(vHS, _mm_load_si128(vPS + i)),
                    case1);
            _mm_store_si128(pvHSStore + i, vHS);

            /* calculate vL */
            vHL = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEL, vFL, case2),
                    _mm_adds_epi16(vHL, vOne),
                    case1);
            _mm_store_si128(pvHLStore + i, vHL);

            vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vH);
            vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vH);
            vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vHM);
            vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vHS);
            vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vHL);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->stats->tables->matches_table, vHM, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->similar_table, vHS, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->length_table, vHL, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->score_table, vH, i, segLen, j, s2Len);
#endif
            vEF_opn = _mm_subs_epi16(vH, vGapO);

            /* Update vE value. */
            vE_ext = _mm_subs_epi16(vE, vGapE);
            vE = _mm_max_epi16(vEF_opn, vE_ext);
            case1 = _mm_cmpgt_epi16(vEF_opn, vE_ext);
            vEM = _mm_blendv_epi8(vEM, vHM, case1);
            vES = _mm_blendv_epi8(vES, vHS, case1);
            vEL = _mm_blendv_epi8(
                    _mm_adds_epi16(vEL, vOne),
                    _mm_adds_epi16(vHL, vOne),
                    case1);
            _mm_store_si128(pvE + i, vE);
            _mm_store_si128(pvEM + i, vEM);
            _mm_store_si128(pvES + i, vES);
            _mm_store_si128(pvEL + i, vEL);

            /* Update vF value. */
            vF_ext = _mm_subs_epi16(vF, vGapE);
            vF = _mm_max_epi16(vEF_opn, vF_ext);
            case1 = _mm_cmpgt_epi16(vEF_opn, vF_ext);
            vFM = _mm_blendv_epi8(vFM, vHM, case1);
            vFS = _mm_blendv_epi8(vFS, vHS, case1);
            vFL = _mm_blendv_epi8(
                    _mm_adds_epi16(vFL, vOne),
                    _mm_adds_epi16(vHL, vOne),
                    case1);

            /* Load the next vH. */
            vH = _mm_load_si128(pvHLoad + i);
            vHM = _mm_load_si128(pvHMLoad + i);
            vHS = _mm_load_si128(pvHSLoad + i);
            vHL = _mm_load_si128(pvHLLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            __m128i vHp = _mm_load_si128(&pvHLoad[segLen - 1]);
            int64_t tmp = boundary[j+1]-open;
            int16_t tmp2 = tmp < INT16_MIN ? INT16_MIN : tmp;
            vHp = _mm_slli_si128(vHp, 2);
            vF = _mm_slli_si128(vF, 2);
            vFM = _mm_slli_si128(vFM, 2);
            vFS = _mm_slli_si128(vFS, 2);
            vFL = _mm_slli_si128(vFL, 2);
            vHp = _mm_insert_epi16(vHp, boundary[j], 0);
            vF = _mm_insert_epi16(vF, tmp2, 0);
            vFL = _mm_insert_epi16(vFL, 1, 0);
            for (i=0; i<segLen; ++i) {
                __m128i case1;
                __m128i case2;
                __m128i cond;

                vHp = _mm_adds_epi16(vHp, _mm_load_si128(vP + i));
                vH = _mm_load_si128(pvHStore + i);
                vH = _mm_max_epi16(vH,vF);
                _mm_store_si128(pvHStore + i, vH);
                case1 = _mm_cmpeq_epi16(vH, vHp);
                case2 = _mm_cmpeq_epi16(vH, vF);
                cond = _mm_andnot_si128(case1, case2);

                /* calculate vM */
                vHM = _mm_load_si128(pvHMStore + i);
                vHM = _mm_blendv_epi8(vHM, vFM, cond);
                _mm_store_si128(pvHMStore + i, vHM);

                /* calculate vS */
                vHS = _mm_load_si128(pvHSStore + i);
                vHS = _mm_blendv_epi8(vHS, vFS, cond);
                _mm_store_si128(pvHSStore + i, vHS);

                /* calculate vL */
                vHL = _mm_load_si128(pvHLStore + i);
                vHL = _mm_blendv_epi8(vHL, vFL, cond);
                _mm_store_si128(pvHLStore + i, vHL);

                vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vH);
                vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vH);
                vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vHM);
                vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vHS);
                vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vHL);
#ifdef PARASAIL_TABLE
                arr_store_si128(result->stats->tables->matches_table, vHM, i, segLen, j, s2Len);
                arr_store_si128(result->stats->tables->similar_table, vHS, i, segLen, j, s2Len);
                arr_store_si128(result->stats->tables->length_table, vHL, i, segLen, j, s2Len);
                arr_store_si128(result->stats->tables->score_table, vH, i, segLen, j, s2Len);
#endif
                /* Update vF value. */
                vEF_opn = _mm_subs_epi16(vH, vGapO);
                vF_ext = _mm_subs_epi16(vF, vGapE);
                if (! _mm_movemask_epi8(
                            _mm_or_si128(
                                _mm_cmpgt_epi16(vF_ext, vEF_opn),
                                _mm_cmpeq_epi16(vF_ext, vEF_opn))))
                    goto end;
                /*vF = _mm_max_epi16(vEF_opn, vF_ext);*/
                vF = vF_ext;
                cond = _mm_cmpgt_epi16(vEF_opn, vF_ext);
                vFM = _mm_blendv_epi8(vFM, vHM, cond);
                vFS = _mm_blendv_epi8(vFS, vHS, cond);
                vFL = _mm_blendv_epi8(
                        _mm_adds_epi16(vFL, vOne),
                        _mm_adds_epi16(vHL, vOne),
                        cond);
                vHp = _mm_load_si128(pvHLoad + i);
            }
        }
end:
        {
        }

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm_load_si128(pvHStore + offset);
            vHM = _mm_load_si128(pvHMStore + offset);
            vHS = _mm_load_si128(pvHSStore + offset);
            vHL = _mm_load_si128(pvHLStore + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128 (vH, 2);
                vHM = _mm_slli_si128 (vHM, 2);
                vHS = _mm_slli_si128 (vHS, 2);
                vHL = _mm_slli_si128 (vHL, 2);
            }
            result->stats->rowcols->score_row[j] = (int16_t) _mm_extract_epi16 (vH, 7);
            result->stats->rowcols->matches_row[j] = (int16_t) _mm_extract_epi16 (vHM, 7);
            result->stats->rowcols->similar_row[j] = (int16_t) _mm_extract_epi16 (vHS, 7);
            result->stats->rowcols->length_row[j] = (int16_t) _mm_extract_epi16 (vHL, 7);
        }
#endif
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvHStore+i);
        __m128i vHM = _mm_load_si128(pvHMStore+i);
        __m128i vHS = _mm_load_si128(pvHSStore+i);
        __m128i vHL = _mm_load_si128(pvHLStore+i);
        arr_store_col(result->stats->rowcols->score_col, vH, i, segLen);
        arr_store_col(result->stats->rowcols->matches_col, vHM, i, segLen);
        arr_store_col(result->stats->rowcols->similar_col, vHS, i, segLen);
        arr_store_col(result->stats->rowcols->length_col, vHL, i, segLen);
    }
#endif

    /* extract last value from the last column */
    {
        __m128i vH = _mm_load_si128(pvHStore + offset);
        __m128i vHM = _mm_load_si128(pvHMStore + offset);
        __m128i vHS = _mm_load_si128(pvHSStore + offset);
        __m128i vHL = _mm_load_si128(pvHLStore + offset);
        for (k=0; k<position; ++k) {
            vH = _mm_slli_si128 (vH, 2);
            vHM = _mm_slli_si128 (vHM, 2);
            vHS = _mm_slli_si128 (vHS, 2);
            vHL = _mm_slli_si128 (vHL, 2);
        }
        score = (int16_t) _mm_extract_epi16 (vH, 7);
        matches = (int16_t) _mm_extract_epi16 (vHM, 7);
        similar = (int16_t) _mm_extract_epi16 (vHS, 7);
        length = (int16_t) _mm_extract_epi16 (vHL, 7);
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi16(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi16(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        matches = 0;
        similar = 0;
        length = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;
    result->stats->matches = matches;
    result->stats->similar = similar;
    result->stats->length = length;

    parasail_free(boundary);
    parasail_free(pvEL);
    parasail_free(pvES);
    parasail_free(pvEM);
    parasail_free(pvE);
    parasail_free(pvHLLoad);
    parasail_free(pvHLStore);
    parasail_free(pvHSLoad);
    parasail_free(pvHSStore);
    parasail_free(pvHMLoad);
    parasail_free(pvHMStore);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}